

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  int *piVar1;
  Mat *pMVar2;
  int iVar3;
  ulong uVar4;
  long in_RCX;
  long in_RDX;
  Mat *in_RSI;
  bool bVar5;
  Mat bottom_blob_fp32;
  Mat bottom_blob_packed;
  int elembits;
  int elemcount;
  int dims;
  int dst_elempack;
  Mat bottom_blob_bf16;
  Option *in_stack_fffffffffffffc58;
  Mat *pMVar6;
  Option *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  int iVar7;
  Mat *in_stack_fffffffffffffc70;
  int local_344;
  int local_2fc;
  Mat local_2f0;
  uint local_2a4;
  Mat local_2a0;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  Mat local_238;
  long local_1f0;
  long local_1e8;
  Mat *local_1e0;
  int local_1cc;
  Mat *local_1c8;
  Mat *local_1c0;
  Mat *local_1b0;
  Mat *local_1a8;
  Mat *local_1a0;
  int local_198;
  undefined4 local_194;
  Mat *local_190;
  Mat *local_188;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  Mat *local_168;
  int local_158;
  undefined4 local_154;
  Mat *local_150;
  Mat *local_148;
  Mat *local_138;
  Mat *local_128;
  Mat *local_118;
  Mat *local_100;
  Mat *local_f8;
  int local_e0;
  undefined4 local_dc;
  Mat *local_d8;
  int local_c0;
  undefined4 local_bc;
  Mat *local_b8;
  int local_a0;
  undefined4 local_9c;
  Mat *local_98;
  int local_90;
  undefined4 local_8c;
  Mat *local_88;
  int local_80;
  undefined4 local_7c;
  Mat *local_78;
  int local_70;
  undefined4 local_6c;
  Mat *local_68;
  Mat *local_60;
  Mat *local_58;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_20;
  void *local_10;
  
  if (in_RSI->elempack == 0) {
    local_2fc = 0;
  }
  else {
    uVar4 = in_RSI->elemsize << 3;
    local_2fc = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                     (long)in_RSI->elempack);
  }
  local_1f0 = in_RCX;
  local_1e8 = in_RDX;
  local_1e0 = in_RSI;
  if (local_2fc == 0x20) {
    if (((*(byte *)(in_RCX + 0x20) & 1) != 0) && ((*(byte *)(in_RDX + 0xc) & 1) != 0)) {
      local_1b0 = &local_238;
      local_238.data = (void *)0x0;
      local_238.refcount = (int *)0x0;
      local_238.elemsize = 0;
      local_238.elempack = 0;
      local_238.allocator = (Allocator *)0x0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      local_238.cstep = 0;
      cast_float32_to_bfloat16
                (in_stack_fffffffffffffc70,
                 (Mat *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 in_stack_fffffffffffffc60);
      pMVar2 = local_1e0;
      local_148 = local_1e0;
      local_150 = &local_238;
      if (local_1e0 != local_150) {
        if (local_238.refcount != (int *)0x0) {
          local_154 = 1;
          LOCK();
          local_158 = *local_238.refcount;
          *local_238.refcount = *local_238.refcount + 1;
          UNLOCK();
        }
        local_88 = local_1e0;
        if (local_1e0->refcount != (int *)0x0) {
          piVar1 = local_1e0->refcount;
          local_8c = 0xffffffff;
          LOCK();
          local_90 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_90 == 1) {
            if (local_1e0->allocator == (Allocator *)0x0) {
              local_38 = local_1e0->data;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (*local_1e0->allocator->_vptr_Allocator[3])(local_1e0->allocator,local_1e0->data);
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->elemsize = 0;
        pMVar2->elempack = 0;
        pMVar2->dims = 0;
        pMVar2->w = 0;
        pMVar2->h = 0;
        pMVar2->d = 0;
        pMVar2->c = 0;
        pMVar2->cstep = 0;
        pMVar2->refcount = (int *)0x0;
        pMVar2->data = local_150->data;
        pMVar2->refcount = local_150->refcount;
        pMVar2->elemsize = local_150->elemsize;
        pMVar2->elempack = local_150->elempack;
        pMVar2->allocator = local_150->allocator;
        pMVar2->dims = local_150->dims;
        pMVar2->w = local_150->w;
        pMVar2->h = local_150->h;
        pMVar2->d = local_150->d;
        pMVar2->c = local_150->c;
        pMVar2->cstep = local_150->cstep;
      }
      local_138 = &local_238;
      local_98 = local_138;
      if (local_238.refcount != (int *)0x0) {
        local_9c = 0xffffffff;
        LOCK();
        local_a0 = *local_238.refcount;
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (local_a0 == 1) {
          if (local_238.allocator == (Allocator *)0x0) {
            local_30 = local_238.data;
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])(local_238.allocator,local_238.data);
          }
        }
      }
      local_238.data = (void *)0x0;
      local_238.elemsize = 0;
      local_238.elempack = 0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      local_238.cstep = 0;
      local_238.refcount = (int *)0x0;
    }
    local_f8 = local_1e0;
    bVar5 = true;
    if (local_1e0->data != (void *)0x0) {
      local_60 = local_1e0;
      bVar5 = local_1e0->cstep * (long)local_1e0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_248 = 1;
  if ((*(byte *)(local_1f0 + 0x27) & 1) != 0) {
    local_24c = local_1e0->dims;
    local_250 = 0;
    if (local_24c == 1) {
      local_250 = local_1e0->elempack * local_1e0->w;
    }
    if (local_24c == 2) {
      local_250 = local_1e0->elempack * local_1e0->h;
    }
    if ((local_24c == 3) || (local_24c == 4)) {
      local_250 = local_1e0->elempack * local_1e0->c;
    }
    local_1c0 = local_1e0;
    if (local_1e0->elempack == 0) {
      local_344 = 0;
    }
    else {
      uVar4 = local_1e0->elemsize << 3;
      local_344 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                       (long)local_1e0->elempack);
    }
    local_254 = local_344;
    if ((*(byte *)(local_1e8 + 0xb) & 1) != 0) {
      if (local_344 == 0x20) {
        if ((local_250 % 0x10 == 0) && (iVar3 = cpu_support_x86_avx512(), iVar3 != 0)) {
          local_248 = 0x10;
        }
        else if ((local_250 % 8 == 0) && (iVar3 = cpu_support_x86_avx(), iVar3 != 0)) {
          local_248 = 8;
        }
        else if (local_250 % 4 == 0) {
          local_248 = 4;
        }
      }
      if ((local_254 == 0x10) && (local_250 % 4 == 0)) {
        local_248 = 4;
      }
      if ((local_254 == 8) && (local_250 % 8 == 0)) {
        local_248 = 8;
      }
    }
  }
  if (local_1e0->elempack != local_248) {
    local_1a8 = &local_2a0;
    local_2a0.data = (void *)0x0;
    local_2a0.refcount = (int *)0x0;
    local_2a0.elemsize = 0;
    local_2a0.elempack = 0;
    local_2a0.allocator = (Allocator *)0x0;
    local_2a0.dims = 0;
    local_2a0.w = 0;
    local_2a0.h = 0;
    local_2a0.d = 0;
    local_2a0.c = 0;
    local_2a0.cstep = 0;
    convert_packing(in_stack_fffffffffffffc70,
                    (Mat *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),iVar7,
                    in_stack_fffffffffffffc58);
    pMVar2 = local_1e0;
    local_168 = local_1e0;
    local_170 = &local_2a0;
    if (local_1e0 != local_170) {
      if (local_2a0.refcount != (int *)0x0) {
        local_174 = 1;
        LOCK();
        local_178 = *local_2a0.refcount;
        *local_2a0.refcount = *local_2a0.refcount + 1;
        UNLOCK();
      }
      local_78 = local_1e0;
      if (local_1e0->refcount != (int *)0x0) {
        piVar1 = local_1e0->refcount;
        local_7c = 0xffffffff;
        LOCK();
        local_80 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_80 == 1) {
          if (local_1e0->allocator == (Allocator *)0x0) {
            local_40 = local_1e0->data;
            if (local_40 != (void *)0x0) {
              free(local_40);
            }
          }
          else {
            (*local_1e0->allocator->_vptr_Allocator[3])(local_1e0->allocator,local_1e0->data);
          }
        }
      }
      pMVar2->data = (void *)0x0;
      pMVar2->elemsize = 0;
      pMVar2->elempack = 0;
      pMVar2->dims = 0;
      pMVar2->w = 0;
      pMVar2->h = 0;
      pMVar2->d = 0;
      pMVar2->c = 0;
      pMVar2->cstep = 0;
      pMVar2->refcount = (int *)0x0;
      pMVar2->data = local_170->data;
      pMVar2->refcount = local_170->refcount;
      pMVar2->elemsize = local_170->elemsize;
      pMVar2->elempack = local_170->elempack;
      pMVar2->allocator = local_170->allocator;
      pMVar2->dims = local_170->dims;
      pMVar2->w = local_170->w;
      pMVar2->h = local_170->h;
      pMVar2->d = local_170->d;
      pMVar2->c = local_170->c;
      pMVar2->cstep = local_170->cstep;
    }
    local_100 = local_1e0;
    bVar5 = true;
    if (local_1e0->data != (void *)0x0) {
      local_58 = local_1e0;
      bVar5 = local_1e0->cstep * (long)local_1e0->c == 0;
    }
    if (bVar5) {
      local_1cc = -100;
    }
    local_2a4 = (uint)bVar5;
    local_128 = &local_2a0;
    local_b8 = local_128;
    if (local_2a0.refcount != (int *)0x0) {
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *local_2a0.refcount;
      *local_2a0.refcount = *local_2a0.refcount + -1;
      UNLOCK();
      if (local_c0 == 1) {
        if (local_2a0.allocator == (Allocator *)0x0) {
          local_20 = local_2a0.data;
          if (local_2a0.data != (void *)0x0) {
            free(local_2a0.data);
          }
        }
        else {
          (*(local_2a0.allocator)->_vptr_Allocator[3])(local_2a0.allocator,local_2a0.data);
        }
      }
    }
    local_2a0.data = (void *)0x0;
    local_2a0.elemsize = 0;
    local_2a0.elempack = 0;
    local_2a0.dims = 0;
    local_2a0.w = 0;
    local_2a0.h = 0;
    local_2a0.d = 0;
    local_2a0.c = 0;
    local_2a0.cstep = 0;
    local_2a0.refcount = (int *)0x0;
    if (local_2a4 != 0) {
      return local_1cc;
    }
  }
  local_1c8 = local_1e0;
  if (local_1e0->elempack == 0) {
    iVar7 = 0;
  }
  else {
    uVar4 = local_1e0->elemsize << 3;
    iVar7 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                 (long)local_1e0->elempack);
  }
  if (iVar7 == 0x10) {
    if (((*(byte *)(local_1f0 + 0x20) & 1) != 0) && ((*(byte *)(local_1e8 + 0xc) & 1) == 0)) {
      local_1a0 = &local_2f0;
      local_2f0.data = (void *)0x0;
      local_2f0.refcount = (int *)0x0;
      local_2f0.elemsize = 0;
      local_2f0.elempack = 0;
      local_2f0.allocator = (Allocator *)0x0;
      local_2f0.dims = 0;
      local_2f0.w = 0;
      local_2f0.h = 0;
      local_2f0.d = 0;
      local_2f0.c = 0;
      local_2f0.cstep = 0;
      cast_bfloat16_to_float32
                (local_1e0,(Mat *)CONCAT44(0x10,in_stack_fffffffffffffc68),(Option *)local_1a0);
      pMVar2 = local_1e0;
      local_188 = local_1e0;
      local_190 = &local_2f0;
      if (local_1e0 != local_190) {
        if (local_2f0.refcount != (int *)0x0) {
          local_194 = 1;
          LOCK();
          local_198 = *local_2f0.refcount;
          *local_2f0.refcount = *local_2f0.refcount + 1;
          UNLOCK();
        }
        local_68 = local_1e0;
        pMVar6 = local_1e0;
        if (local_1e0->refcount != (int *)0x0) {
          piVar1 = local_1e0->refcount;
          local_6c = 0xffffffff;
          LOCK();
          local_70 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_70 == 1) {
            if (local_1e0->allocator == (Allocator *)0x0) {
              local_48 = local_1e0->data;
              if (local_48 != (void *)0x0) {
                free(local_48);
              }
            }
            else {
              (*local_1e0->allocator->_vptr_Allocator[3])(local_1e0->allocator,local_1e0->data);
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->elemsize = 0;
        pMVar2->elempack = 0;
        pMVar2->dims = 0;
        pMVar2->w = 0;
        pMVar2->h = 0;
        pMVar2->d = 0;
        pMVar2->c = 0;
        pMVar2->cstep = 0;
        pMVar2->refcount = (int *)0x0;
        pMVar6->data = local_190->data;
        pMVar6->refcount = local_190->refcount;
        pMVar6->elemsize = local_190->elemsize;
        pMVar6->elempack = local_190->elempack;
        pMVar6->allocator = local_190->allocator;
        pMVar6->dims = local_190->dims;
        pMVar6->w = local_190->w;
        pMVar6->h = local_190->h;
        pMVar6->d = local_190->d;
        pMVar6->c = local_190->c;
        pMVar6->cstep = local_190->cstep;
      }
      local_118 = &local_2f0;
      if (local_2f0.refcount != (int *)0x0) {
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *local_2f0.refcount;
        *local_2f0.refcount = *local_2f0.refcount + -1;
        UNLOCK();
        if (local_e0 == 1) {
          local_d8 = local_118;
          if (local_2f0.allocator == (Allocator *)0x0) {
            local_10 = local_2f0.data;
            if (local_2f0.data != (void *)0x0) {
              free(local_2f0.data);
            }
          }
          else {
            (*(local_2f0.allocator)->_vptr_Allocator[3])(local_2f0.allocator,local_2f0.data);
          }
        }
      }
    }
    bVar5 = true;
    if (local_1e0->data != (void *)0x0) {
      bVar5 = local_1e0->cstep * (long)local_1e0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    if (bottom_blob.elembits() == 32)
    {
        // clang-format off
        // *INDENT-OFF*

#if NCNN_ARM82
        if (opt.use_fp16_storage && cpu_support_arm_asimdhp() && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_ARM82
#if NCNN_VFPV4
        if (opt.use_fp16_storage && !opt.use_bf16_storage && cpu_support_arm_vfpv4() && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_VFPV4
#if NCNN_ZFH
        if (opt.use_fp16_storage && (ncnn::cpu_support_riscv_zvfh() || (!ncnn::cpu_support_riscv_v() && ncnn::cpu_support_riscv_zfh())) && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_ZFH
#if NCNN_BF16
        if (opt.use_bf16_storage && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        else
#endif // NCNN_BF16
        {
        }

        // *INDENT-ON*
        // clang-format on

        if (bottom_blob.empty())
            return -100;
    }

    int dst_elempack = 1;
    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3 || dims == 4) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if NCNN_AVX512
                if (elemcount % 16 == 0 && ncnn::cpu_support_x86_avx512())
                    dst_elempack = 16;
                else if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_AVX
                if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && ncnn::cpu_support_arm_asimdhp() && opt.use_fp16_arithmetic && layer->support_fp16_storage)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }
    }

    if (bottom_blob.elempack != dst_elempack)
    {
        Mat bottom_blob_packed;
        convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
        bottom_blob = bottom_blob_packed;

        if (bottom_blob.empty())
            return -100;
    }

    if (bottom_blob.elembits() == 16)
    {
        // clang-format off
        // *INDENT-OFF*

#if NCNN_ARM82
        if (opt.use_fp16_storage && cpu_support_arm_asimdhp() && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_ARM82
#if NCNN_VFPV4
        if (opt.use_fp16_storage && !opt.use_bf16_storage && cpu_support_arm_vfpv4() && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_VFPV4
#if NCNN_ZFH
        if (opt.use_fp16_storage && (ncnn::cpu_support_riscv_zvfh() || (!ncnn::cpu_support_riscv_v() && ncnn::cpu_support_riscv_zfh())) && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_ZFH
#if NCNN_BF16
        if (opt.use_bf16_storage && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_BF16
        {
        }

        // *INDENT-ON*
        // clang-format on

        if (bottom_blob.empty())
            return -100;
    }

    return 0;
}